

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

MessageLite * __thiscall google::protobuf::internal::ClassData::New(ClassData *this,Arena *arena)

{
  MessageLite *pMVar1;
  Arena *arena_local;
  ClassData *this_local;
  
  pMVar1 = MessageCreator::New<false,google::protobuf::MessageLite>
                     (&this->message_creator,this->prototype,this->prototype,arena);
  return pMVar1;
}

Assistant:

MessageLite* New(Arena* arena) const {
    return message_creator.New(prototype, prototype, arena);
  }